

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorPicker::setCol(QColorPicker *this,int h,int s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect QVar8;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (h < 1) {
    h = 0;
  }
  if (0x166 < h) {
    h = 0x167;
  }
  iVar2 = 0;
  if (0 < s) {
    iVar2 = s;
  }
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  if ((h != this->hue) || (iVar2 != this->sat)) {
    QVar7 = QWidget::contentsRect((QWidget *)this);
    iVar5 = (QVar7.x2.m_i.m_i - QVar7.x1.m_i) * (0x168 - this->hue);
    iVar1 = iVar5 >> 0x1f;
    iVar6 = -iVar1;
    iVar1 = iVar5 / 0x168 + iVar1;
    iVar3 = (QVar7.y2.m_i.m_i - QVar7.y1.m_i) * (0xff - this->sat);
    iVar5 = iVar3 >> 0x1f;
    iVar4 = -iVar5;
    iVar5 = iVar3 / 0xff + iVar5;
    local_48.y1.m_i = iVar5 + iVar4;
    local_48.x1.m_i = iVar1 + iVar6;
    local_48.y2.m_i = iVar5 + 0x13 + iVar4;
    local_48.x2.m_i = iVar1 + 0x13 + iVar6;
    this->hue = h;
    this->sat = iVar2;
    QVar7 = QWidget::contentsRect((QWidget *)this);
    iVar1 = (QVar7.x2.m_i.m_i - QVar7.x1.m_i) * (0x168 - this->hue);
    iVar2 = iVar1 >> 0x1f;
    iVar4 = -iVar2;
    iVar2 = iVar1 / 0x168 + iVar2;
    local_58.x1.m_i = iVar2 + iVar4;
    iVar5 = (QVar7.y2.m_i.m_i - QVar7.y1.m_i) * (0xff - this->sat);
    iVar1 = iVar5 >> 0x1f;
    iVar3 = -iVar1;
    iVar1 = iVar5 / 0xff + iVar1;
    local_58.y1.m_i = iVar1 + iVar3;
    local_58.x2.m_i = iVar2 + 0x13 + iVar4;
    local_58.y2.m_i = iVar1 + iVar3 + 0x13;
    local_48 = (QRect)QRect::operator|(&local_48,&local_58);
    QVar7 = QWidget::contentsRect((QWidget *)this);
    QVar8 = QWidget::contentsRect((QWidget *)this);
    local_48.y1.m_i = QVar8.y1.m_i.m_i + -9 + local_48.y1.m_i;
    local_48.x1.m_i = QVar7.x1.m_i.m_i + -9 + local_48.x1.m_i;
    local_48.y2.m_i = QVar8.y1.m_i.m_i + -9 + local_48.y2.m_i;
    local_48.x2.m_i = QVar7.x1.m_i.m_i + -9 + local_48.x2.m_i;
    QWidget::repaint((QWidget *)this,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::setCol(int h, int s)
{
    int nhue = qMin(qMax(0,h), 359);
    int nsat = qMin(qMax(0,s), 255);
    if (nhue == hue && nsat == sat)
        return;

    QRect r(colPt(), QSize(20,20));
    hue = nhue; sat = nsat;
    r = r.united(QRect(colPt(), QSize(20,20)));
    r.translate(contentsRect().x()-9, contentsRect().y()-9);
    //    update(r);
    repaint(r);
}